

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_remove_run_compression(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  shared_container_t *container;
  run_container_t *run;
  _Bool _Var2;
  int iVar3;
  container_t *pcVar4;
  ulong uVar5;
  uint8_t type_after;
  uint8_t local_29;
  
  if ((r->high_low_container).size < 1) {
    _Var2 = false;
  }
  else {
    uVar5 = 0;
    _Var2 = false;
    do {
      uVar1 = (r->high_low_container).typecodes[uVar5 & 0xffff];
      container = (shared_container_t *)(r->high_low_container).containers[uVar5 & 0xffff];
      if (uVar1 == '\x03') {
        iVar3 = run_container_cardinality((run_container_t *)container);
        pcVar4 = convert_to_bitset_or_array_container((run_container_t *)container,iVar3,&local_29);
        run_container_free((run_container_t *)container);
LAB_001163f0:
        (r->high_low_container).containers[uVar5] = pcVar4;
        (r->high_low_container).typecodes[uVar5] = local_29;
        _Var2 = true;
      }
      else if ((uVar1 == '\x04') && (container->typecode == '\x03')) {
        run = (run_container_t *)container->container;
        iVar3 = run_container_cardinality(run);
        pcVar4 = convert_to_bitset_or_array_container(run,iVar3,&local_29);
        shared_container_free(container);
        goto LAB_001163f0;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)(r->high_low_container).size);
  }
  return _Var2;
}

Assistant:

bool roaring_bitmap_remove_run_compression(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        if (get_container_type(c, type_original) == RUN_CONTAINER_TYPE) {
            answer = true;
            if (type_original == SHARED_CONTAINER_TYPE) {
                run_container_t *truec = CAST_run(CAST_shared(c)->container);
                int32_t card = run_container_cardinality(truec);
                container_t *c1 = convert_to_bitset_or_array_container(
                    truec, card, &type_after);
                shared_container_free(CAST_shared(c));  // frees run as needed
                ra_set_container_at_index(&r->high_low_container, i, c1,
                                          type_after);

            } else {
                int32_t card = run_container_cardinality(CAST_run(c));
                container_t *c1 = convert_to_bitset_or_array_container(
                    CAST_run(c), card, &type_after);
                run_container_free(CAST_run(c));
                ra_set_container_at_index(&r->high_low_container, i, c1,
                                          type_after);
            }
        }
    }
    return answer;
}